

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaResub.c
# Opt level: O1

int Gia_ManUnivTfo(Gia_Man_t *p,int *pObjs,int nObjs,Vec_Int_t **pvNodes,Vec_Int_t **pvPos)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int *piVar3;
  Vec_Int_t *vPos;
  int iVar4;
  ulong uVar5;
  
  if (pvNodes != (Vec_Int_t **)0x0) {
    if (*pvNodes == (Vec_Int_t *)0x0) {
      pVVar2 = (Vec_Int_t *)malloc(0x10);
      pVVar2->nCap = 100;
      pVVar2->nSize = 0;
      piVar3 = (int *)malloc(400);
      pVVar2->pArray = piVar3;
      *pvNodes = pVVar2;
    }
    else {
      (*pvNodes)->nSize = 0;
    }
  }
  if (pvPos != (Vec_Int_t **)0x0) {
    if (*pvPos == (Vec_Int_t *)0x0) {
      pVVar2 = (Vec_Int_t *)malloc(0x10);
      pVVar2->nCap = 100;
      pVVar2->nSize = 0;
      piVar3 = (int *)malloc(400);
      pVVar2->pArray = piVar3;
      *pvPos = pVVar2;
    }
    else {
      (*pvPos)->nSize = 0;
    }
  }
  Gia_ManIncrementTravId(p);
  if (nObjs < 1) {
    iVar4 = 0;
  }
  else {
    uVar5 = 0;
    iVar4 = 0;
    do {
      if (pvNodes == (Vec_Int_t **)0x0) {
        pVVar2 = (Vec_Int_t *)0x0;
      }
      else {
        pVVar2 = *pvNodes;
      }
      if (pvPos == (Vec_Int_t **)0x0) {
        vPos = (Vec_Int_t *)0x0;
      }
      else {
        vPos = *pvPos;
      }
      iVar1 = Gia_ManUnivTfo_rec(p,pObjs[uVar5],pVVar2,vPos);
      iVar4 = iVar4 + iVar1;
      uVar5 = uVar5 + 1;
    } while ((uint)nObjs != uVar5);
  }
  if (pvNodes != (Vec_Int_t **)0x0) {
    qsort((*pvNodes)->pArray,(long)(*pvNodes)->nSize,4,Vec_IntSortCompare1);
  }
  if (pvPos != (Vec_Int_t **)0x0) {
    qsort((*pvPos)->pArray,(long)(*pvPos)->nSize,4,Vec_IntSortCompare1);
  }
  return iVar4;
}

Assistant:

int Gia_ManUnivTfo( Gia_Man_t * p, int * pObjs, int nObjs, Vec_Int_t ** pvNodes, Vec_Int_t ** pvPos )
{
    int i, Count = 0;
    if ( pvNodes )
    {
        if ( *pvNodes )
            Vec_IntClear( *pvNodes );
        else
            *pvNodes = Vec_IntAlloc( 100 );
    }
    if ( pvPos )
    {
        if ( *pvPos )
            Vec_IntClear( *pvPos );
        else
            *pvPos = Vec_IntAlloc( 100 );
    }
    Gia_ManIncrementTravId( p );
    for ( i = 0; i < nObjs; i++ )
        Count += Gia_ManUnivTfo_rec( p, pObjs[i], pvNodes ? *pvNodes : NULL, pvPos ? *pvPos : NULL );
    if ( pvNodes )
        Vec_IntSort( *pvNodes, 0 );
    if ( pvPos )
        Vec_IntSort( *pvPos, 0 );
    return Count;
}